

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_allocator.c
# Opt level: O3

void * memory_allocator_reallocate
                 (memory_allocator allocator,void *data,size_t size,size_t new_size)

{
  size_t *psVar1;
  void *pvVar2;
  
  pvVar2 = (*allocator->iface->reallocate)(allocator->impl,data,size,new_size);
  psVar1 = &(allocator->size).realloc + (pvVar2 == (void *)0x0);
  *psVar1 = *psVar1 + 1;
  return pvVar2;
}

Assistant:

void *memory_allocator_reallocate(memory_allocator allocator, void *data, size_t size, size_t new_size)
{
	void *new_data = allocator->iface->reallocate(allocator->impl, data, size, new_size);

	if (new_data == NULL)
	{
		++allocator->size.bad_realloc;
	}
	else
	{
		++allocator->size.realloc;
	}

	return new_data;
}